

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISentenceReader.cpp
# Opt level: O2

void __thiscall ISentenceReader::getWord(ISentenceReader *this,string *str)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  do {
    iVar2 = std::istream::get();
    iVar2 = iVar2 << 0x18;
    if (iVar2 == -0x1000000) {
      if ((str->_M_string_length == 0) ||
         ((str->_M_dataplus)._M_p[str->_M_string_length - 1] == this->m_seg)) {
        return;
      }
      break;
    }
    cVar1 = this->m_seg;
    std::__cxx11::string::push_back((char)str);
    if (iVar2 >> 0x18 == (int)cVar1) {
      return;
    }
    if (iVar2 == 0x7d000000) {
      iVar3 = iVar3 + -1;
    }
    else if (iVar2 == 0x7b000000) {
      iVar3 = iVar3 + 1;
    }
    else if (iVar2 == 0xa000000) {
      std::__cxx11::string::push_back((char)str);
    }
  } while (-1 < iVar3);
  std::__cxx11::string::assign((char *)str);
  return;
}

Assistant:

void ISentenceReader::getWord(std::string &str) {
    char tempChar;
    int num3=0;

    while((tempChar = m_ifs->get()) != EOF)
    {
        if(tempChar!=m_seg)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='{')
                num3++;
            else if(tempChar=='}')
                num3--;
            if(num3<0)
            {
                str="";
                return;
            }
        }
        else
        {
            str+=tempChar;
            return;
        }
    }
    if(!str.empty()&&str[str.length()-1]!=m_seg)
    {
        str="";
    }
}